

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall
fasttext::Dictionary::Dictionary(Dictionary *this,shared_ptr<fasttext::Args> *args,istream *in)

{
  std::__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)this,
             &args->super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>);
  this->ntokens_ = 0;
  (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pdiscard_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pdiscard_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->nlabels_ = 0;
  (this->pdiscard_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->size_ = 0;
  this->nwords_ = 0;
  this->pruneidx_size_ = -1;
  (this->pruneidx_)._M_h._M_buckets = &(this->pruneidx_)._M_h._M_single_bucket;
  (this->pruneidx_)._M_h._M_bucket_count = 1;
  (this->pruneidx_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pruneidx_)._M_h._M_element_count = 0;
  (this->pruneidx_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pruneidx_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pruneidx_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  load(this,in);
  return;
}

Assistant:

Dictionary::Dictionary(std::shared_ptr<Args> args, std::istream& in)
    : args_(args),
      size_(0),
      nwords_(0),
      nlabels_(0),
      ntokens_(0),
      pruneidx_size_(-1) {
  load(in);
}